

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

mem_expr_t find_mem_expr(gen_ctx_t gen_ctx,MIR_insn_t mem_insn)

{
  int iVar1;
  mem_expr_t el;
  mem_expr_t e;
  mem_expr_t tab_e;
  MIR_insn_t mem_insn_local;
  gen_ctx_t gen_ctx_local;
  
  tab_e = (mem_expr_t)mem_insn;
  mem_insn_local = (MIR_insn_t)gen_ctx;
  iVar1 = move_code_p((MIR_insn_code_t)*(undefined8 *)&mem_insn->field_0x18);
  if ((iVar1 != 0) &&
     ((((ulong)tab_e[1].next & 0xff) == 0xb || (((ulong)tab_e[3].next & 0xff) == 0xb)))) {
    el = VARR_mem_expr_tget((VARR_mem_expr_t *)((mem_insn_local[4].insn_link.next)->insn_link).next,
                            (ulong)*(uint *)&(tab_e->insn->insn_link).next);
    iVar1 = HTAB_mem_expr_t_do((HTAB_mem_expr_t *)(mem_insn_local[4].insn_link.next)->ops[0].data,el
                               ,HTAB_FIND,&e);
    if (iVar1 == 0) {
      gen_ctx_local = (gen_ctx_t)0x0;
    }
    else {
      gen_ctx_local = (gen_ctx_t)e;
    }
    return (mem_expr_t)gen_ctx_local;
  }
  __assert_fail("move_code_p (mem_insn->code) && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0xe90,"mem_expr_t find_mem_expr(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static mem_expr_t find_mem_expr (gen_ctx_t gen_ctx, MIR_insn_t mem_insn) {
  mem_expr_t tab_e, e;

  gen_assert (
    move_code_p (mem_insn->code)
    && (mem_insn->ops[0].mode == MIR_OP_VAR_MEM || mem_insn->ops[1].mode == MIR_OP_VAR_MEM));
  e = VARR_GET (mem_expr_t, mem_exprs, ((bb_insn_t) mem_insn->data)->mem_index);
  if (HTAB_DO (mem_expr_t, mem_expr_tab, e, HTAB_FIND, tab_e)) return tab_e;
  return NULL;
}